

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandQueueVkImpl.cpp
# Opt level: O3

Uint64 __thiscall Diligent::CommandQueueVkImpl::WaitForIdle(CommandQueueVkImpl *this)

{
  atomic<unsigned_long> *paVar1;
  Uint64 Value;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->m_QueueMutex);
  if (iVar2 == 0) {
    LOCK();
    paVar1 = &this->m_NextFenceValue;
    Value = (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    (*vkQueueWaitIdle)(this->m_VkQueue);
    FenceVkImpl::Wait((this->m_pFence).m_pObject,0xffffffffffffffff);
    FenceVkImpl::Reset((this->m_pFence).m_pObject,Value);
    pthread_mutex_unlock((pthread_mutex_t *)&this->m_QueueMutex);
    return Value;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

Uint64 CommandQueueVkImpl::WaitForIdle()
{
    std::lock_guard<std::mutex> QueueGuard{m_QueueMutex};

    // Update last completed fence value to unlock all waiting events.
    const auto FenceValue = m_NextFenceValue.fetch_add(1);

    vkQueueWaitIdle(m_VkQueue);
    // For some reason after idling the queue not all fences are signaled
    m_pFence->Wait(UINT64_MAX);
    m_pFence->Reset(FenceValue);

    return FenceValue;
}